

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O1

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>>::
write_byte_string<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>>::read_byte_string_from_buffer>
          (basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>> *this,
          read_byte_string_from_buffer *read,item_event_visitor *visitor,error_code *ec)

{
  ushort *puVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  basic_bigint<std::allocator<unsigned_char>_> *n_00;
  _func_int **pp_Var5;
  ulong uVar6;
  undefined8 uVar7;
  bigint n;
  basic_bigint<std::allocator<unsigned_char>_> local_98;
  basic_bigint<std::allocator<unsigned_char>_> local_70;
  basic_bigint<std::allocator<unsigned_char>_> local_48;
  
  if (((byte)this[0x20] & 4) == 0) {
    read_byte_string_from_buffer::operator()
              (read,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0x80),ec);
    if (ec->_M_value != 0) {
      return;
    }
    local_98._0_8_ = *(undefined8 *)(this + 0x80);
    local_98.field_0._0_8_ = *(long *)(this + 0x88) - local_98._0_8_;
    (*visitor->_vptr_basic_item_event_visitor[0xc])(visitor,&local_98,0,this,ec);
    this[8] = (basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>>)((byte)this[10] ^ 1);
    return;
  }
  lVar3 = *(long *)(this + 0x10);
  if (lVar3 < 0x16) {
    if (lVar3 == 2) {
      if (*(long *)(this + 0x88) != *(long *)(this + 0x80)) {
        *(long *)(this + 0x88) = *(long *)(this + 0x80);
      }
      read_byte_string_from_buffer::operator()
                (read,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0x80),ec);
      if (ec->_M_value != 0) goto LAB_0025cfe9;
      basic_bigint<std::allocator<unsigned_char>_>::from_bytes_be
                (&local_98,1,*(uint8_t **)(this + 0x80),
                 *(long *)(this + 0x88) - (long)*(uint8_t **)(this + 0x80));
      *(undefined8 *)(this + 0x68) = 0;
      **(undefined1 **)(this + 0x60) = 0;
      basic_bigint<std::allocator<unsigned_char>>::
      write_string<char,std::char_traits<char>,std::allocator<char>>
                ((basic_bigint<std::allocator<unsigned_char>> *)&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x60))
      ;
      local_70.field_0._0_8_ = *(undefined8 *)(this + 0x60);
      local_70._0_8_ = *(undefined8 *)(this + 0x68);
      (*visitor->_vptr_basic_item_event_visitor[0xb])(visitor,&local_70,2,this,ec);
      write_byte_string<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>>::read_byte_string_from_buffer>
                ();
      goto LAB_0025cfd9;
    }
    if (lVar3 == 3) {
      if (*(long *)(this + 0x88) != *(long *)(this + 0x80)) {
        *(long *)(this + 0x88) = *(long *)(this + 0x80);
      }
      read_byte_string_from_buffer::operator()
                (read,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0x80),ec);
      if (ec->_M_value == 0) {
        basic_bigint<std::allocator<unsigned_char>_>::from_bytes_be
                  (&local_98,1,*(uint8_t **)(this + 0x80),
                   *(long *)(this + 0x88) - (long)*(uint8_t **)(this + 0x80));
        local_48.field_0._0_1_ = local_48.field_0._0_1_ & 0xfc | 2;
        local_48.field_0.common_stor_.length_ = 1;
        local_48.field_0.short_stor_.values_[0] = 1;
        local_48.field_0.short_stor_.values_[1] = 0;
        n_00 = basic_bigint<std::allocator<unsigned_char>_>::operator-=(&local_48,&local_98);
        basic_bigint<std::allocator<unsigned_char>_>::basic_bigint(&local_70,n_00);
        basic_bigint<std::allocator<unsigned_char>_>::operator=(&local_98,&local_70);
        if (((local_70.field_0._0_8_ & 1) != 0) &&
           ((pointer)local_70.field_0.short_stor_.values_[1] != (pointer)0x0)) {
          operator_delete(local_70.field_0.dynamic_stor_.data_,
                          local_70.field_0.short_stor_.values_[0] << 3);
        }
        if (((local_48.field_0._0_1_ & 1) != 0) &&
           ((pointer)local_48.field_0.short_stor_.values_[1] != (pointer)0x0)) {
          operator_delete(local_48.field_0.dynamic_stor_.data_,
                          local_48.field_0.short_stor_.values_[0] << 3);
        }
        *(undefined8 *)(this + 0x68) = 0;
        **(undefined1 **)(this + 0x60) = 0;
        basic_bigint<std::allocator<unsigned_char>>::
        write_string<char,std::char_traits<char>,std::allocator<char>>
                  ((basic_bigint<std::allocator<unsigned_char>> *)&local_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (this + 0x60));
        local_70.field_0._0_8_ = *(undefined8 *)(this + 0x60);
        local_70._0_8_ = *(undefined8 *)(this + 0x68);
        (*visitor->_vptr_basic_item_event_visitor[0xb])(visitor,&local_70,2,this,ec);
        write_byte_string<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>>::read_byte_string_from_buffer>
                  ();
        goto LAB_0025cfd9;
      }
      goto LAB_0025cfe9;
    }
    if (lVar3 == 0x15) {
      read_byte_string_from_buffer::operator()
                (read,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0x80),ec);
      if (ec->_M_value != 0) goto LAB_0025cfe9;
      local_98._0_8_ = *(undefined8 *)(this + 0x80);
      local_98.field_0._0_8_ = *(long *)(this + 0x88) - local_98._0_8_;
      pp_Var5 = visitor->_vptr_basic_item_event_visitor;
      uVar7 = 0xc;
      goto LAB_0025cfc8;
    }
switchD_0025c628_caseD_4c:
    read_byte_string_from_buffer::operator()
              (read,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0x80),ec);
    if (ec->_M_value != 0) {
LAB_0025cfe9:
      this[8] = (basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>>)0x0;
      return;
    }
    local_98._0_8_ = *(undefined8 *)(this + 0x80);
    local_98.field_0._0_8_ = *(long *)(this + 0x88) - local_98._0_8_;
    (*visitor->_vptr_basic_item_event_visitor[0xd])
              (visitor,&local_98,*(undefined8 *)(this + 0x10),this,ec);
    goto LAB_0025cfd1;
  }
  switch(lVar3) {
  case 0x40:
    if (*(long *)(this + 0xb8) != *(long *)(this + 0xb0)) {
      *(long *)(this + 0xb8) = *(long *)(this + 0xb0);
    }
    read_byte_string_from_buffer::operator()
              (read,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0xb0),ec);
    if (ec->_M_value != 0) goto LAB_0025cfe9;
    local_98._0_8_ = *(undefined8 *)(this + 0xb0);
    local_98.field_0._0_8_ = *(long *)(this + 0xb8) - local_98._0_8_;
    pp_Var5 = visitor->_vptr_basic_item_event_visitor;
    uVar7 = 0;
    goto LAB_0025cf7c;
  case 0x41:
  case 0x45:
    if (*(long *)(this + 0xb8) != *(long *)(this + 0xb0)) {
      *(long *)(this + 0xb8) = *(long *)(this + 0xb0);
    }
    read_byte_string_from_buffer::operator()
              (read,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0xb0),ec);
    if (ec->_M_value != 0) goto LAB_0025cfe9;
    uVar6 = *(ulong *)(this + 0x10);
    local_98._0_8_ = *(undefined8 *)(this + 0xb0);
    local_98.field_0._0_8_ =
         (ulong)(*(long *)(this + 0xb8) - local_98._0_8_) >>
         ((byte)uVar6 & 3) + (((uint)uVar6 >> 4 & 1) != 0);
    if (((uVar6 & 4) == 0) && (local_98.field_0._0_8_ != 0)) {
      uVar6 = 0;
      do {
        puVar1 = (ushort *)(local_98._0_8_ + uVar6 * 2);
        *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
        uVar6 = uVar6 + 1;
      } while (local_98.field_0._0_8_ != uVar6);
    }
    (*visitor->_vptr_basic_item_event_visitor[0x13])(visitor,&local_98,0,this,ec);
    break;
  case 0x42:
  case 0x46:
    if (*(long *)(this + 0xb8) != *(long *)(this + 0xb0)) {
      *(long *)(this + 0xb8) = *(long *)(this + 0xb0);
    }
    read_byte_string_from_buffer::operator()
              (read,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0xb0),ec);
    if (ec->_M_value != 0) goto LAB_0025cfe9;
    uVar6 = *(ulong *)(this + 0x10);
    local_98._0_8_ = *(undefined8 *)(this + 0xb0);
    local_98.field_0._0_8_ =
         (ulong)(*(long *)(this + 0xb8) - local_98._0_8_) >>
         ((byte)uVar6 & 3) + (((uint)uVar6 >> 4 & 1) != 0);
    if (((uVar6 & 4) == 0) && (local_98.field_0._0_8_ != 0)) {
      uVar6 = 0;
      do {
        uVar2 = *(uint *)(local_98._0_8_ + uVar6 * 4);
        *(uint *)(local_98._0_8_ + uVar6 * 4) =
             uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        uVar6 = uVar6 + 1;
      } while (local_98.field_0._0_8_ != uVar6);
    }
    (*visitor->_vptr_basic_item_event_visitor[0x14])(visitor,&local_98,0,this,ec);
    break;
  case 0x43:
  case 0x47:
    if (*(long *)(this + 0xb8) != *(long *)(this + 0xb0)) {
      *(long *)(this + 0xb8) = *(long *)(this + 0xb0);
    }
    read_byte_string_from_buffer::operator()
              (read,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0xb0),ec);
    if (ec->_M_value != 0) goto LAB_0025cfe9;
    uVar6 = *(ulong *)(this + 0x10);
    local_98._0_8_ = *(undefined8 *)(this + 0xb0);
    local_98.field_0._0_8_ =
         (ulong)(*(long *)(this + 0xb8) - local_98._0_8_) >>
         ((byte)uVar6 & 3) + (((uint)uVar6 >> 4 & 1) != 0);
    if (((uVar6 & 4) == 0) && (local_98.field_0._0_8_ != 0)) {
      uVar6 = 0;
      do {
        uVar4 = *(ulong *)(local_98._0_8_ + uVar6 * 8);
        *(ulong *)(local_98._0_8_ + uVar6 * 8) =
             uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
             (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
             (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
        uVar6 = uVar6 + 1;
      } while (local_98.field_0._0_8_ != uVar6);
    }
    (*visitor->_vptr_basic_item_event_visitor[0x15])(visitor,&local_98,0,this,ec);
    break;
  case 0x44:
    if (*(long *)(this + 0xb8) != *(long *)(this + 0xb0)) {
      *(long *)(this + 0xb8) = *(long *)(this + 0xb0);
    }
    read_byte_string_from_buffer::operator()
              (read,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0xb0),ec);
    if (ec->_M_value != 0) goto LAB_0025cfe9;
    local_98._0_8_ = *(undefined8 *)(this + 0xb0);
    local_98.field_0._0_8_ = *(long *)(this + 0xb8) - local_98._0_8_;
    pp_Var5 = visitor->_vptr_basic_item_event_visitor;
    uVar7 = 0x11;
LAB_0025cf7c:
    (*pp_Var5[0x12])(visitor,&local_98,uVar7,this,ec);
    break;
  case 0x48:
    if (*(long *)(this + 0xb8) != *(long *)(this + 0xb0)) {
      *(long *)(this + 0xb8) = *(long *)(this + 0xb0);
    }
    read_byte_string_from_buffer::operator()
              (read,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0xb0),ec);
    if (ec->_M_value != 0) goto LAB_0025cfe9;
    local_98._0_8_ = *(undefined8 *)(this + 0xb0);
    local_98.field_0._0_8_ = *(long *)(this + 0xb8) - local_98._0_8_;
    (*visitor->_vptr_basic_item_event_visitor[0x16])(visitor,&local_98,0,this,ec);
    break;
  case 0x49:
  case 0x4d:
    if (*(long *)(this + 0xb8) != *(long *)(this + 0xb0)) {
      *(long *)(this + 0xb8) = *(long *)(this + 0xb0);
    }
    read_byte_string_from_buffer::operator()
              (read,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0xb0),ec);
    if (ec->_M_value != 0) goto LAB_0025cfe9;
    uVar6 = *(ulong *)(this + 0x10);
    local_98._0_8_ = *(undefined8 *)(this + 0xb0);
    local_98.field_0._0_8_ =
         (ulong)(*(long *)(this + 0xb8) - local_98._0_8_) >>
         ((byte)uVar6 & 3) + (((uint)uVar6 >> 4 & 1) != 0);
    if (((uVar6 & 4) == 0) && (local_98.field_0._0_8_ != 0)) {
      uVar6 = 0;
      do {
        puVar1 = (ushort *)(local_98._0_8_ + uVar6 * 2);
        *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
        uVar6 = uVar6 + 1;
      } while (local_98.field_0._0_8_ != uVar6);
    }
    (*visitor->_vptr_basic_item_event_visitor[0x17])(visitor,&local_98,0,this,ec);
    break;
  case 0x4a:
  case 0x4e:
    if (*(long *)(this + 0xb8) != *(long *)(this + 0xb0)) {
      *(long *)(this + 0xb8) = *(long *)(this + 0xb0);
    }
    read_byte_string_from_buffer::operator()
              (read,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0xb0),ec);
    if (ec->_M_value != 0) goto LAB_0025cfe9;
    uVar6 = *(ulong *)(this + 0x10);
    local_98._0_8_ = *(undefined8 *)(this + 0xb0);
    local_98.field_0._0_8_ =
         (ulong)(*(long *)(this + 0xb8) - local_98._0_8_) >>
         ((byte)uVar6 & 3) + (((uint)uVar6 >> 4 & 1) != 0);
    if (((uVar6 & 4) == 0) && (local_98.field_0._0_8_ != 0)) {
      uVar6 = 0;
      do {
        uVar2 = *(uint *)(local_98._0_8_ + uVar6 * 4);
        *(uint *)(local_98._0_8_ + uVar6 * 4) =
             uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        uVar6 = uVar6 + 1;
      } while (local_98.field_0._0_8_ != uVar6);
    }
    (*visitor->_vptr_basic_item_event_visitor[0x18])(visitor,&local_98,0,this,ec);
    break;
  case 0x4b:
  case 0x4f:
    if (*(long *)(this + 0xb8) != *(long *)(this + 0xb0)) {
      *(long *)(this + 0xb8) = *(long *)(this + 0xb0);
    }
    read_byte_string_from_buffer::operator()
              (read,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0xb0),ec);
    if (ec->_M_value != 0) goto LAB_0025cfe9;
    uVar6 = *(ulong *)(this + 0x10);
    local_98._0_8_ = *(undefined8 *)(this + 0xb0);
    local_98.field_0._0_8_ =
         (ulong)(*(long *)(this + 0xb8) - local_98._0_8_) >>
         ((byte)uVar6 & 3) + (((uint)uVar6 >> 4 & 1) != 0);
    if (((uVar6 & 4) == 0) && (local_98.field_0._0_8_ != 0)) {
      uVar6 = 0;
      do {
        uVar4 = *(ulong *)(local_98._0_8_ + uVar6 * 8);
        *(ulong *)(local_98._0_8_ + uVar6 * 8) =
             uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
             (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
             (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
        uVar6 = uVar6 + 1;
      } while (local_98.field_0._0_8_ != uVar6);
    }
    (*visitor->_vptr_basic_item_event_visitor[0x19])(visitor,&local_98,0,this,ec);
    break;
  case 0x4c:
  case 0x53:
    goto switchD_0025c628_caseD_4c;
  case 0x50:
  case 0x54:
    if (*(long *)(this + 0xb8) != *(long *)(this + 0xb0)) {
      *(long *)(this + 0xb8) = *(long *)(this + 0xb0);
    }
    read_byte_string_from_buffer::operator()
              (read,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0xb0),ec);
    if (ec->_M_value != 0) goto LAB_0025cfe9;
    uVar6 = *(ulong *)(this + 0x10);
    local_98._0_8_ = *(undefined8 *)(this + 0xb0);
    local_98.field_0._0_8_ =
         (ulong)(*(long *)(this + 0xb8) - local_98._0_8_) >>
         ((byte)uVar6 & 3) + (((uint)uVar6 >> 4 & 1) != 0);
    if (((uVar6 & 4) == 0) && (local_98.field_0._0_8_ != 0)) {
      uVar6 = 0;
      do {
        puVar1 = (ushort *)(local_98._0_8_ + uVar6 * 2);
        *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
        uVar6 = uVar6 + 1;
      } while (local_98.field_0._0_8_ != uVar6);
    }
    (*visitor->_vptr_basic_item_event_visitor[0x1a])(visitor,&local_98,0,this,ec);
    break;
  case 0x51:
  case 0x55:
    if (*(long *)(this + 0xb8) != *(long *)(this + 0xb0)) {
      *(long *)(this + 0xb8) = *(long *)(this + 0xb0);
    }
    read_byte_string_from_buffer::operator()
              (read,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0xb0),ec);
    if (ec->_M_value != 0) goto LAB_0025cfe9;
    uVar6 = *(ulong *)(this + 0x10);
    local_98._0_8_ = *(undefined8 *)(this + 0xb0);
    local_98.field_0._0_8_ =
         (ulong)(*(long *)(this + 0xb8) - local_98._0_8_) >>
         ((byte)uVar6 & 3) + (((uint)uVar6 >> 4 & 1) != 0);
    if (((uVar6 & 4) == 0) && (local_98.field_0._0_8_ != 0)) {
      uVar6 = 0;
      do {
        uVar2 = *(uint *)(local_98._0_8_ + uVar6 * 4);
        *(uint *)(local_98._0_8_ + uVar6 * 4) =
             uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        uVar6 = uVar6 + 1;
      } while (local_98.field_0._0_8_ != uVar6);
    }
    (*visitor->_vptr_basic_item_event_visitor[0x1b])(visitor,&local_98,0,this,ec);
    break;
  case 0x52:
  case 0x56:
    if (*(long *)(this + 0xb8) != *(long *)(this + 0xb0)) {
      *(long *)(this + 0xb8) = *(long *)(this + 0xb0);
    }
    read_byte_string_from_buffer::operator()
              (read,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0xb0),ec);
    if (ec->_M_value != 0) goto LAB_0025cfe9;
    uVar6 = *(ulong *)(this + 0x10);
    local_98._0_8_ = *(undefined8 *)(this + 0xb0);
    local_98.field_0._0_8_ =
         (ulong)(*(long *)(this + 0xb8) - local_98._0_8_) >>
         ((byte)uVar6 & 3) + (((uint)uVar6 >> 4 & 1) != 0);
    if (((uVar6 & 4) == 0) && (local_98.field_0._0_8_ != 0)) {
      uVar6 = 0;
      do {
        uVar4 = *(ulong *)(local_98._0_8_ + uVar6 * 8);
        *(ulong *)(local_98._0_8_ + uVar6 * 8) =
             uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
             (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
             (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
        uVar6 = uVar6 + 1;
      } while (local_98.field_0._0_8_ != uVar6);
    }
    (*visitor->_vptr_basic_item_event_visitor[0x1c])(visitor,&local_98,0,this,ec);
    break;
  default:
    if (lVar3 == 0x16) {
      read_byte_string_from_buffer::operator()
                (read,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0x80),ec);
      if (ec->_M_value != 0) goto LAB_0025cfe9;
      local_98._0_8_ = *(undefined8 *)(this + 0x80);
      local_98.field_0._0_8_ = *(long *)(this + 0x88) - local_98._0_8_;
      pp_Var5 = visitor->_vptr_basic_item_event_visitor;
      uVar7 = 9;
    }
    else {
      if (lVar3 != 0x17) goto switchD_0025c628_caseD_4c;
      read_byte_string_from_buffer::operator()
                (read,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0x80),ec);
      if (ec->_M_value != 0) goto LAB_0025cfe9;
      local_98._0_8_ = *(undefined8 *)(this + 0x80);
      local_98.field_0._0_8_ = *(long *)(this + 0x88) - local_98._0_8_;
      pp_Var5 = visitor->_vptr_basic_item_event_visitor;
      uVar7 = 8;
    }
LAB_0025cfc8:
    (*pp_Var5[0xc])(visitor,&local_98,uVar7,this,ec);
  }
LAB_0025cfd1:
  this[8] = (basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>>)((byte)this[10] ^ 1);
LAB_0025cfd9:
  this[0x20] = (basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>>)
               ((byte)this[0x20] & 0xfb);
  return;
}

Assistant:

void write_byte_string(Read read, item_event_visitor& visitor, std::error_code& ec)
    {
        if (other_tags_[item_tag])
        {
            switch (raw_tag_)
            {
                case 0x2:
                {
                    bytes_buffer_.clear();
                    read(bytes_buffer_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    bigint n = bigint::from_bytes_be(1, bytes_buffer_.data(), bytes_buffer_.size());
                    text_buffer_.clear();
                    n.write_string(text_buffer_);
                    visitor.string_value(text_buffer_, semantic_tag::bigint, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x3:
                {
                    bytes_buffer_.clear();
                    read(bytes_buffer_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    bigint n = bigint::from_bytes_be(1, bytes_buffer_.data(), bytes_buffer_.size());
                    n = -1 - n;
                    text_buffer_.clear();
                    n.write_string(text_buffer_);
                    visitor.string_value(text_buffer_, semantic_tag::bigint, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x15:
                {
                    read(bytes_buffer_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    visitor.byte_string_value(bytes_buffer_, semantic_tag::base64url, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x16:
                {
                    read(bytes_buffer_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    visitor.byte_string_value(bytes_buffer_, semantic_tag::base64, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x17:
                {
                    read(bytes_buffer_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    visitor.byte_string_value(bytes_buffer_, semantic_tag::base16, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x40:
                {
                    typed_array_.clear();
                    read(typed_array_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    uint8_t* data = reinterpret_cast<uint8_t*>(typed_array_.data());
                    std::size_t size = typed_array_.size();
                    visitor.typed_array(jsoncons::span<const uint8_t>(data,size), semantic_tag::none, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x44:
                {
                    typed_array_.clear();
                    read(typed_array_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    uint8_t* data = reinterpret_cast<uint8_t*>(typed_array_.data());
                    std::size_t size = typed_array_.size();
                    visitor.typed_array(jsoncons::span<const uint8_t>(data,size), semantic_tag::clamped, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x41:
                case 0x45:
                {
                    typed_array_.clear();
                    read(typed_array_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    const uint8_t tag = (uint8_t)raw_tag_;
                    jsoncons::endian e = get_typed_array_endianness(tag); 
                    const size_t bytes_per_elem = get_typed_array_bytes_per_element(tag);

                    uint16_t* data = reinterpret_cast<uint16_t*>(typed_array_.data());
                    std::size_t size = typed_array_.size()/bytes_per_elem;

                    if (e != jsoncons::endian::native)
                    {
                        for (std::size_t i = 0; i < size; ++i)
                        {
                            data[i] = binary::byte_swap<uint16_t>(data[i]);
                        }
                    }
                    visitor.typed_array(jsoncons::span<const uint16_t>(data,size), semantic_tag::none, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x42:
                case 0x46:
                {
                    typed_array_.clear();
                    read(typed_array_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    const uint8_t tag = (uint8_t)raw_tag_;
                    jsoncons::endian e = get_typed_array_endianness(tag);
                    const size_t bytes_per_elem = get_typed_array_bytes_per_element(tag);

                    uint32_t* data = reinterpret_cast<uint32_t*>(typed_array_.data());
                    std::size_t size = typed_array_.size()/bytes_per_elem;
                    if (e != jsoncons::endian::native)
                    {
                        for (std::size_t i = 0; i < size; ++i)
                        {
                            data[i] = binary::byte_swap<uint32_t>(data[i]);
                        }
                    }
                    visitor.typed_array(jsoncons::span<const uint32_t>(data,size), semantic_tag::none, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x43:
                case 0x47:
                {
                    typed_array_.clear();
                    read(typed_array_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    const uint8_t tag = (uint8_t)raw_tag_;
                    jsoncons::endian e = get_typed_array_endianness(tag); 
                    const size_t bytes_per_elem = get_typed_array_bytes_per_element(tag);

                    uint64_t* data = reinterpret_cast<uint64_t*>(typed_array_.data());
                    std::size_t size = typed_array_.size()/bytes_per_elem;
                    if (e != jsoncons::endian::native)
                    {
                        for (std::size_t i = 0; i < size; ++i)
                        {
                            data[i] = binary::byte_swap<uint64_t>(data[i]);
                        }
                    }
                    visitor.typed_array(jsoncons::span<const uint64_t>(data,size), semantic_tag::none, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x48:
                {
                    typed_array_.clear();
                    read(typed_array_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    int8_t* data = reinterpret_cast<int8_t*>(typed_array_.data());
                    std::size_t size = typed_array_.size();
                    visitor.typed_array(jsoncons::span<const int8_t>(data,size), semantic_tag::none, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x49:
                case 0x4d:
                {
                    typed_array_.clear();
                    read(typed_array_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    const uint8_t tag = (uint8_t)raw_tag_;
                    jsoncons::endian e = get_typed_array_endianness(tag); 
                    const size_t bytes_per_elem = get_typed_array_bytes_per_element(tag);

                    int16_t* data = reinterpret_cast<int16_t*>(typed_array_.data());
                    std::size_t size = typed_array_.size()/bytes_per_elem;
                    if (e != jsoncons::endian::native)
                    {
                        for (std::size_t i = 0; i < size; ++i)
                        {
                            data[i] = binary::byte_swap<int16_t>(data[i]);
                        }
                    }
                    visitor.typed_array(jsoncons::span<const int16_t>(data,size), semantic_tag::none, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x4a:
                case 0x4e:
                {
                    typed_array_.clear();
                    read(typed_array_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    const uint8_t tag = (uint8_t)raw_tag_;
                    jsoncons::endian e = get_typed_array_endianness(tag); 
                    const size_t bytes_per_elem = get_typed_array_bytes_per_element(tag);

                    int32_t* data = reinterpret_cast<int32_t*>(typed_array_.data());
                    std::size_t size = typed_array_.size()/bytes_per_elem;
                    if (e != jsoncons::endian::native)
                    {
                        for (std::size_t i = 0; i < size; ++i)
                        {
                            data[i] = binary::byte_swap<int32_t>(data[i]);
                        }
                    }
                    visitor.typed_array(jsoncons::span<const int32_t>(data,size), semantic_tag::none, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x4b:
                case 0x4f:
                {
                    typed_array_.clear();
                    read(typed_array_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    const uint8_t tag = (uint8_t)raw_tag_;
                    jsoncons::endian e = get_typed_array_endianness(tag); 
                    const size_t bytes_per_elem = get_typed_array_bytes_per_element(tag);

                    int64_t* data = reinterpret_cast<int64_t*>(typed_array_.data());
                    std::size_t size = typed_array_.size()/bytes_per_elem;
                    if (e != jsoncons::endian::native)
                    {
                        for (std::size_t i = 0; i < size; ++i)
                        {
                            data[i] = binary::byte_swap<int64_t>(data[i]);
                        }
                    }
                    visitor.typed_array(jsoncons::span<const int64_t>(data,size), semantic_tag::none, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x50:
                case 0x54:
                {
                    typed_array_.clear();
                    read(typed_array_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    const uint8_t tag = (uint8_t)raw_tag_;
                    jsoncons::endian e = get_typed_array_endianness(tag); 
                    const size_t bytes_per_elem = get_typed_array_bytes_per_element(tag);

                    uint16_t* data = reinterpret_cast<uint16_t*>(typed_array_.data());
                    std::size_t size = typed_array_.size()/bytes_per_elem;
                    if (e != jsoncons::endian::native)
                    {
                        for (std::size_t i = 0; i < size; ++i)
                        {
                            data[i] = binary::byte_swap<uint16_t>(data[i]);
                        }
                    }
                    visitor.typed_array(half_arg, jsoncons::span<const uint16_t>(data,size), semantic_tag::none, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x51:
                case 0x55:
                {
                    typed_array_.clear();
                    read(typed_array_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    const uint8_t tag = (uint8_t)raw_tag_;
                    jsoncons::endian e = get_typed_array_endianness(tag); 
                    const size_t bytes_per_elem = get_typed_array_bytes_per_element(tag);

                    float* data = reinterpret_cast<float*>(typed_array_.data());
                    std::size_t size = typed_array_.size()/bytes_per_elem;
                    if (e != jsoncons::endian::native)
                    {
                        for (std::size_t i = 0; i < size; ++i)
                        {
                            data[i] = binary::byte_swap<float>(data[i]);
                        }
                    }
                    visitor.typed_array(jsoncons::span<const float>(data,size), semantic_tag::none, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                case 0x52:
                case 0x56:
                {
                    typed_array_.clear();
                    read(typed_array_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    const uint8_t tag = (uint8_t)raw_tag_;
                    jsoncons::endian e = get_typed_array_endianness(tag); 
                    const size_t bytes_per_elem = get_typed_array_bytes_per_element(tag);

                    double* data = reinterpret_cast<double*>(typed_array_.data());
                    std::size_t size = typed_array_.size()/bytes_per_elem;

                    if (e != jsoncons::endian::native)
                    {
                        for (std::size_t i = 0; i < size; ++i)
                        {
                            data[i] = binary::byte_swap<double>(data[i]);
                        }
                    }
                    visitor.typed_array(jsoncons::span<const double>(data,size), semantic_tag::none, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
                default:
                {
                    read(bytes_buffer_,ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    visitor.byte_string_value(bytes_buffer_, raw_tag_, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
            }
            other_tags_[item_tag] = false;
        }
        else
        {
            read(bytes_buffer_,ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                return;
            }
            visitor.byte_string_value(bytes_buffer_, semantic_tag::none, *this, ec);
            more_ = !cursor_mode_;
        }
    }